

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O3

float __thiscall
RTIMUBMX055::bmm050_compensate_Y_float(RTIMUBMX055 *this,int16_t mag_data_y,uint16_t data_r)

{
  undefined2 in_register_00000012;
  undefined2 in_register_00000032;
  float fVar1;
  
  fVar1 = 0.0;
  if (CONCAT22(in_register_00000012,data_r) != 0 &&
      CONCAT22(in_register_00000032,mag_data_y) != -0x1000) {
    fVar1 = ((float)this->m_dig_xyz1 * 16384.0) / (float)data_r + -16384.0;
    fVar1 = ((float)(int)this->m_dig_y1 * 8.0 +
            ((float)(int)this->m_dig_y2 + 160.0) *
            ((float)this->m_dig_xy1 * fVar1 * 6.1035156e-05 +
             fVar1 * fVar1 * 3.7252903e-09 * (float)(int)this->m_dig_xy2 + 256.0) *
            (float)(int)mag_data_y * 0.00012207031) * 0.0625;
  }
  return fVar1;
}

Assistant:

float RTIMUBMX055::bmm050_compensate_Y_float(int16_t mag_data_y, uint16_t data_r)
{
    float inter_retval = BMM050_ZERO_U8X;
    if (mag_data_y != BMM050_FLIP_OVERFLOW_ADCVAL /* no overflow */
       ) {
        if (data_r != C_BMM050_ZERO_U8X) {
            inter_retval = ((((float)m_dig_xyz1)
            * BMM050_FLOAT_ONE_SIX_THREE_EIGHT_FOUR
            /data_r) - BMM050_FLOAT_ONE_SIX_THREE_EIGHT_FOUR);
        } else {
            inter_retval = BMM050_OVERFLOW_OUTPUT_FLOAT;
            return inter_retval;
        }
        inter_retval = (((mag_data_y * ((((((float)m_dig_xy2) *
            (inter_retval*inter_retval
            / BMM050_FLOAT_2_6_8_4_3_5_4_5_6_DATA) +
            inter_retval * ((float)m_dig_xy1)
            / BMM050_FLOAT_1_6_3_8_4_DATA)) +
            BMM050_FLOAT_2_5_6_DATA) *
            (((float)m_dig_y2) + BMM050_FLOAT_1_6_0_DATA)))
            / BMM050_FLOAT_8_1_9_2_DATA) +
            (((float)m_dig_y1) * BMM050_FLOAT_EIGHT_DATA))
            / BMM050_FLOAT_SIXTEEN_DATA;
    } else {
        /* overflow, set output to 0.0f */
        inter_retval = BMM050_OVERFLOW_OUTPUT_FLOAT;
    }
    return inter_retval;
}